

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O2

void __thiscall MasterObjectHolder::clearCore(MasterObjectHolder *this,int index)

{
  _Elt_pointer puVar1;
  size_type sVar2;
  reference puVar3;
  __uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *this_00;
  difference_type dVar4;
  long lVar5;
  _Elt_pointer puVar6;
  _Elt_pointer puVar7;
  _Map_pointer ppuVar8;
  _Map_pointer ppuVar9;
  handle coreList;
  _Self local_68;
  handle local_48;
  _Self local_30;
  
  gmlc::libguarded::
  guarded<std::deque<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>,_std::mutex>
  ::lock(&local_48,&this->cores);
  sVar2 = std::
          deque<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
          ::size(local_48.data);
  if ((index < 0) || ((int)sVar2 <= index)) goto LAB_00176de1;
  puVar3 = std::
           _Deque_iterator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_&,_std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_*>
           ::operator[](&((local_48.data)->
                         super__Deque_base<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
                         )._M_impl.super__Deque_impl_data._M_start,(ulong)(uint)index);
  ((puVar3->_M_t).
   super___uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_>._M_t.
   super__Tuple_impl<0UL,_helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>.
   super__Head_base<0UL,_helics::CoreObject_*,_false>._M_head_impl)->valid = 0;
  this_00 = (__uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)
            std::
            _Deque_iterator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_&,_std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_*>
            ::operator[](&((local_48.data)->
                          super__Deque_base<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
                          )._M_impl.super__Deque_impl_data._M_start,(ulong)(uint)index);
  std::__uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::reset
            (this_00,(pointer)0x0);
  sVar2 = std::
          deque<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
          ::size(local_48.data);
  if (sVar2 < 0xb) goto LAB_00176de1;
  puVar1 = ((local_48.data)->
           super__Deque_base<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
           )._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_30._M_node =
       ((local_48.data)->
       super__Deque_base<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_node;
  local_68._M_cur =
       ((local_48.data)->
       super__Deque_base<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_68._M_first =
       ((local_48.data)->
       super__Deque_base<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_first;
  local_68._M_last =
       ((local_48.data)->
       super__Deque_base<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_last;
  local_68._M_node =
       ((local_48.data)->
       super__Deque_base<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_node;
  local_30._M_first =
       ((local_48.data)->
       super__Deque_base<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_30._M_last =
       ((local_48.data)->
       super__Deque_base<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_30._M_cur = puVar1;
  dVar4 = std::operator-(&local_30,&local_68);
  puVar7 = local_68._M_last;
  ppuVar9 = local_68._M_node;
  for (lVar5 = dVar4 >> 2; 0 < lVar5; lVar5 = lVar5 + -1) {
    puVar6 = local_68._M_cur;
    if (((local_68._M_cur)->_M_t).
        super___uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_>._M_t.
        super__Tuple_impl<0UL,_helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>.
        super__Head_base<0UL,_helics::CoreObject_*,_false>._M_head_impl != (CoreObject *)0x0)
    goto LAB_00176dd2;
    local_68._M_cur = local_68._M_cur + 1;
    ppuVar8 = ppuVar9;
    if (local_68._M_cur == puVar7) {
      ppuVar8 = ppuVar9 + 1;
      local_68._M_cur = ppuVar9[1];
      puVar7 = local_68._M_cur + 0x40;
      local_68._M_first = local_68._M_cur;
      local_68._M_last = puVar7;
      local_68._M_node = ppuVar8;
    }
    puVar6 = local_68._M_cur;
    if (((local_68._M_cur)->_M_t).
        super___uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_>._M_t.
        super__Tuple_impl<0UL,_helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>.
        super__Head_base<0UL,_helics::CoreObject_*,_false>._M_head_impl != (CoreObject *)0x0)
    goto LAB_00176dd2;
    local_68._M_cur = local_68._M_cur + 1;
    ppuVar9 = ppuVar8;
    if (local_68._M_cur == puVar7) {
      ppuVar9 = ppuVar8 + 1;
      local_68._M_cur = ppuVar8[1];
      puVar7 = local_68._M_cur + 0x40;
      local_68._M_first = local_68._M_cur;
      local_68._M_last = puVar7;
      local_68._M_node = ppuVar9;
    }
    puVar6 = local_68._M_cur;
    if (((local_68._M_cur)->_M_t).
        super___uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_>._M_t.
        super__Tuple_impl<0UL,_helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>.
        super__Head_base<0UL,_helics::CoreObject_*,_false>._M_head_impl != (CoreObject *)0x0)
    goto LAB_00176dd2;
    local_68._M_cur = local_68._M_cur + 1;
    ppuVar8 = ppuVar9;
    if (local_68._M_cur == puVar7) {
      ppuVar8 = ppuVar9 + 1;
      local_68._M_cur = ppuVar9[1];
      puVar7 = local_68._M_cur + 0x40;
      local_68._M_first = local_68._M_cur;
      local_68._M_last = puVar7;
      local_68._M_node = ppuVar8;
    }
    puVar6 = local_68._M_cur;
    if (((local_68._M_cur)->_M_t).
        super___uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_>._M_t.
        super__Tuple_impl<0UL,_helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>.
        super__Head_base<0UL,_helics::CoreObject_*,_false>._M_head_impl != (CoreObject *)0x0)
    goto LAB_00176dd2;
    local_68._M_cur = local_68._M_cur + 1;
    ppuVar9 = ppuVar8;
    if (local_68._M_cur == puVar7) {
      ppuVar9 = ppuVar8 + 1;
      local_68._M_cur = ppuVar8[1];
      puVar7 = local_68._M_cur + 0x40;
      local_68._M_first = local_68._M_cur;
      local_68._M_last = puVar7;
      local_68._M_node = ppuVar9;
    }
  }
  dVar4 = std::operator-(&local_30,&local_68);
  if (dVar4 == 3) {
    puVar6 = local_68._M_cur;
    if (((local_68._M_cur)->_M_t).
        super___uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_>._M_t.
        super__Tuple_impl<0UL,_helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>.
        super__Head_base<0UL,_helics::CoreObject_*,_false>._M_head_impl == (CoreObject *)0x0) {
      local_68._M_cur = local_68._M_cur + 1;
      if (local_68._M_cur == local_68._M_last) {
        local_68._M_cur = local_68._M_node[1];
        local_68._M_last = local_68._M_cur + 0x40;
        local_68._M_first = local_68._M_cur;
        local_68._M_node = local_68._M_node + 1;
      }
      goto LAB_00176d7f;
    }
  }
  else if (dVar4 == 2) {
LAB_00176d7f:
    puVar6 = local_68._M_cur;
    if (((local_68._M_cur)->_M_t).
        super___uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_>._M_t.
        super__Tuple_impl<0UL,_helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>.
        super__Head_base<0UL,_helics::CoreObject_*,_false>._M_head_impl == (CoreObject *)0x0) {
      local_68._M_cur = local_68._M_cur + 1;
      if (local_68._M_cur == local_68._M_last) {
        local_68._M_cur = local_68._M_node[1];
        local_68._M_last = local_68._M_cur + 0x40;
        local_68._M_first = local_68._M_cur;
        local_68._M_node = local_68._M_node + 1;
      }
      goto LAB_00176dbb;
    }
  }
  else {
    if (dVar4 == 1) {
LAB_00176dbb:
      puVar6 = local_68._M_cur;
      if (((local_68._M_cur)->_M_t).
          super___uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_>._M_t.
          super__Tuple_impl<0UL,_helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>.
          super__Head_base<0UL,_helics::CoreObject_*,_false>._M_head_impl != (CoreObject *)0x0)
      goto LAB_00176dd2;
    }
    puVar6 = local_30._M_cur;
  }
LAB_00176dd2:
  if (puVar1 == puVar6) {
    std::
    deque<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
    ::clear(local_48.data);
  }
LAB_00176de1:
  std::unique_lock<std::mutex>::~unique_lock(&local_48.m_handle_lock);
  return;
}

Assistant:

void MasterObjectHolder::clearCore(int index)
{
    auto coreList = cores.lock();
    if ((index < static_cast<int>(coreList->size())) && (index >= 0)) {
        (*coreList)[index]->valid = 0;
        (*coreList)[index] = nullptr;
        if (coreList->size() > 10) {
            if (std::none_of(coreList->begin(), coreList->end(), [](const auto& core) { return static_cast<bool>(core); })) {
                coreList->clear();
            }
        }
    }
}